

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
TempBanGameCommand::trigger
          (TempBanGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  long lVar1;
  PlayerInfo *pPVar2;
  char *pcVar3;
  undefined8 uVar4;
  seconds sVar5;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  char *in_R9;
  char *pcVar6;
  long lVar7;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> dVar8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  char *local_38;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)0x13ab6f;
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_a8,(jessilib *)parameters._M_str,
             (char *)((jessilib *)parameters._M_str + parameters._M_len)," \t","",in_R9);
  sVar5 = pluginInstance.m_defaultTempBanTime;
  lVar7 = CONCAT44(local_a8.first._M_len._4_4_,(undefined4)local_a8.first._M_len);
  if (lVar7 == 0) {
    pcVar3 = "Error: Too few parameters. Syntax: tban [Duration] <player> [Reason]";
    uVar4 = 0x44;
    goto LAB_001324a9;
  }
  pcVar3 = (char *)CONCAT44(local_a8.first._M_str._4_4_,local_a8.first._M_str._0_4_);
  lVar1 = CONCAT44(local_a8.second._M_len._4_4_,(undefined4)local_a8.second._M_len);
  pcVar6 = (char *)CONCAT44(local_a8.second._M_str._4_4_,local_a8.second._M_str._0_4_);
  pPVar2 = (PlayerInfo *)RenX::Server::getPlayerByPartName(source,lVar7,pcVar3);
  if (pPVar2 == (PlayerInfo *)0x0) {
    if (CONCAT44(local_a8.second._M_len._4_4_,(undefined4)local_a8.second._M_len) != 0) {
      dVar8 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (pcVar3,pcVar3 + lVar7);
      sVar5.__r = (rep)dVar8.duration.__r;
      if (0 < sVar5.__r) {
        if (pluginInstance.m_maxTempBanTime.__r < sVar5.__r) {
          sVar5 = pluginInstance.m_maxTempBanTime;
        }
        args_2 = (basic_string_view<char,_std::char_traits<char>_> *)0x13ab6f;
        jessilib::
        word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&local_80,
                   (jessilib *)CONCAT44(local_a8.second._M_str._4_4_,local_a8.second._M_str._0_4_),
                   (char *)((jessilib *)
                            CONCAT44(local_a8.second._M_str._4_4_,local_a8.second._M_str._0_4_) +
                           CONCAT44(local_a8.second._M_len._4_4_,(undefined4)local_a8.second._M_len)
                           )," \t","",in_R9);
        local_a8.first._M_len._0_4_ = local_80._M_dataplus._M_p._0_4_;
        local_a8.first._M_len._4_4_ = local_80._M_dataplus._M_p._4_4_;
        local_a8.first._M_str._0_4_ = (undefined4)local_80._M_string_length;
        local_a8.first._M_str._4_4_ = local_80._M_string_length._4_4_;
        local_a8.second._M_len._0_4_ = local_80.field_2._M_allocated_capacity._0_4_;
        local_a8.second._M_len._4_4_ = local_80.field_2._M_allocated_capacity._4_4_;
        local_a8.second._M_str._0_4_ = local_80.field_2._8_4_;
        local_a8.second._M_str._4_4_ = local_80.field_2._12_4_;
        lVar1 = CONCAT44(local_80.field_2._M_allocated_capacity._4_4_,
                         local_80.field_2._M_allocated_capacity._0_4_);
        pcVar6 = "No reason";
        if (lVar1 != 0) {
          pcVar6 = (char *)CONCAT44(local_80.field_2._12_4_,local_80.field_2._8_4_);
        }
        lVar7 = 9;
        if (lVar1 != 0) {
          lVar7 = lVar1;
        }
        pPVar2 = (PlayerInfo *)
                 RenX::Server::getPlayerByPartName
                           (source,CONCAT44(local_80._M_dataplus._M_p._4_4_,
                                            local_80._M_dataplus._M_p._0_4_),
                            CONCAT44(local_80._M_string_length._4_4_,
                                     (undefined4)local_80._M_string_length));
        if (pPVar2 != (PlayerInfo *)0x0) goto LAB_00132374;
      }
    }
    pcVar3 = "Error: Player not found.";
    uVar4 = 0x18;
  }
  else {
    if (lVar1 == 0) {
      pcVar6 = "No reason";
    }
    lVar7 = 9;
    if (lVar1 != 0) {
      lVar7 = lVar1;
    }
LAB_00132374:
    if (pPVar2 == player) {
      pcVar3 = "Error: You can\'t ban yourself.";
      uVar4 = 0x1e;
    }
    else {
      if (player->access <= pPVar2->access) {
        local_40 = 0x22;
        local_38 = "Error: You can\'t ban higher level ";
        local_50._M_len = pluginInstance.m_staffTitle._M_string_length;
        local_50._M_str = pluginInstance.m_staffTitle._M_dataplus._M_p;
        local_60._M_len = 2;
        local_60._M_str = "s.";
        jessilib::
        join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (&local_80,(jessilib *)&local_40,&local_50,&local_60,args_2);
        RenX::Server::sendMessage
                  (source,player,
                   CONCAT44(local_80._M_string_length._4_4_,(undefined4)local_80._M_string_length),
                   CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_) ==
            &local_80.field_2) {
          return;
        }
        operator_delete((undefined1 *)
                        CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_),
                        CONCAT44(local_80.field_2._M_allocated_capacity._4_4_,
                                 local_80.field_2._M_allocated_capacity._0_4_) + 1);
        return;
      }
      RenX::Server::banPlayer
                (source,pPVar2,(player->name)._M_string_length,(player->name)._M_dataplus._M_p,lVar7
                 ,pcVar6,sVar5.__r);
      pcVar3 = "Player has been temporarily banned and kicked from the game.";
      uVar4 = 0x3c;
    }
  }
LAB_001324a9:
  RenX::Server::sendMessage(source,player,uVar4,pcVar3);
  return;
}

Assistant:

void TempBanGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.first.empty()) {
		std::string_view name = split_parameters.first;
		std::chrono::seconds duration = pluginInstance.getDefaultTBanTime();
		std::string_view reason = split_parameters.second;

		RenX::PlayerInfo *target = source->getPlayerByPartName(name);
		if (target == nullptr
			&& !split_parameters.second.empty()) {
			// Try reading first token as duration
			duration = jessilib::duration_from_string(name.data(), name.data() + name.size()).duration;
			if (duration.count() > 0) {
				duration = std::min(duration, pluginInstance.getMaxTBanTime());
				split_parameters = jessilib::word_split_once_view(split_parameters.second, WHITESPACE_SV);
				name = split_parameters.first;
				reason = split_parameters.second;
				target = source->getPlayerByPartName(name);
			}
		}

		if (reason.empty()) {
			reason = "No reason"sv;
		}

		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (player == target)
			source->sendMessage(*player, "Error: You can't ban yourself."sv);
		else if (target->access >= player->access)
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can't ban higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		else
		{
			source->banPlayer(*target, player->name, reason, duration);
			source->sendMessage(*player, "Player has been temporarily banned and kicked from the game."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: tban [Duration] <player> [Reason]"sv);
}